

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O3

int enter_block_callback(MD_BLOCKTYPE type,void *detail,void *userdata)

{
  size_t sVar1;
  undefined8 uVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  char acStack_58 [72];
  
  pcVar4 = acStack_58;
  switch(type) {
  case MD_BLOCK_QUOTE:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "<blockquote>\n";
    uVar5 = 0xd;
    break;
  case MD_BLOCK_UL:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "<ul>\n";
    goto LAB_0010d41d;
  case MD_BLOCK_OL:
    if (*detail != 1) {
      snprintf(acStack_58,0x40,"<ol start=\"%u\">\n");
      goto LAB_0010d4d6;
    }
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "<ol>\n";
    goto LAB_0010d41d;
  case MD_BLOCK_LI:
    if (*detail == 0) {
      (**userdata)("<li>",4,*(undefined8 *)((long)userdata + 8));
      return 0;
    }
    (**userdata)("<li class=\"task-list-item\"><input type=\"checkbox\" class=\"task-list-item-checkbox\" disabled"
                 ,0x5a);
    if ((*(byte *)((long)detail + 4) | 0x20) == 0x78) {
      uVar2 = *(undefined8 *)((long)userdata + 8);
      pcVar4 = " checked";
      uVar6 = 8;
LAB_0010d478:
      (**userdata)(pcVar4,uVar6,uVar2);
    }
    goto LAB_0010d47a;
  case MD_BLOCK_HR:
    uVar3 = *(uint *)((long)userdata + 0x10) & 8;
    pcVar4 = "<hr />\n";
    if (uVar3 == 0) {
      pcVar4 = "<hr>\n";
    }
    uVar5 = (ulong)(uVar3 >> 2 | 5);
    uVar2 = *(undefined8 *)((long)userdata + 8);
    break;
  case MD_BLOCK_H:
    pcVar4 = enter_block_callback::head[*detail - 1];
LAB_0010d4d6:
    sVar1 = strlen(pcVar4);
    uVar2 = *(undefined8 *)((long)userdata + 8);
    uVar5 = sVar1 & 0xffffffff;
    break;
  case MD_BLOCK_CODE:
    (**userdata)("<pre><code",10,*(undefined8 *)((long)userdata + 8));
    if (*(long *)((long)detail + 0x20) != 0) {
      (**userdata)(" class=\"language-",0x11,*(undefined8 *)((long)userdata + 8));
      render_attribute((MD_HTML *)userdata,(MD_ATTRIBUTE *)((long)detail + 0x20),render_html_escaped
                      );
      uVar2 = *(undefined8 *)((long)userdata + 8);
      pcVar4 = "\"";
      uVar6 = 1;
      goto LAB_0010d478;
    }
LAB_0010d47a:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = ">";
    uVar5 = 1;
    break;
  default:
    goto switchD_0010d327_caseD_8;
  case MD_BLOCK_P:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "<p>";
    uVar5 = 3;
    break;
  case MD_BLOCK_TABLE:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "<table>\n";
    goto LAB_0010d4b6;
  case MD_BLOCK_THEAD:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "<thead>\n";
    goto LAB_0010d4b6;
  case MD_BLOCK_TBODY:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "<tbody>\n";
LAB_0010d4b6:
    uVar5 = 8;
    break;
  case MD_BLOCK_TR:
    uVar2 = *(undefined8 *)((long)userdata + 8);
    pcVar4 = "<tr>\n";
LAB_0010d41d:
    uVar5 = 5;
    break;
  case MD_BLOCK_TH:
    pcVar4 = "th";
    goto LAB_0010d385;
  case MD_BLOCK_TD:
    pcVar4 = "td";
LAB_0010d385:
    render_open_td_block((MD_HTML *)userdata,pcVar4,(MD_BLOCK_TD_DETAIL *)detail);
    goto switchD_0010d327_caseD_8;
  }
  (**userdata)(pcVar4,uVar5,uVar2);
switchD_0010d327_caseD_8:
  return 0;
}

Assistant:

static int
enter_block_callback(MD_BLOCKTYPE type, void* detail, void* userdata)
{
    static const MD_CHAR* head[6] = { "<h1>", "<h2>", "<h3>", "<h4>", "<h5>", "<h6>" };
    MD_HTML* r = (MD_HTML*) userdata;

    switch(type) {
        case MD_BLOCK_DOC:      /* noop */ break;
        case MD_BLOCK_QUOTE:    RENDER_VERBATIM(r, "<blockquote>\n"); break;
        case MD_BLOCK_UL:       RENDER_VERBATIM(r, "<ul>\n"); break;
        case MD_BLOCK_OL:       render_open_ol_block(r, (const MD_BLOCK_OL_DETAIL*)detail); break;
        case MD_BLOCK_LI:       render_open_li_block(r, (const MD_BLOCK_LI_DETAIL*)detail); break;
        case MD_BLOCK_HR:       RENDER_VERBATIM(r, (r->flags & MD_HTML_FLAG_XHTML) ? "<hr />\n" : "<hr>\n"); break;
        case MD_BLOCK_H:        RENDER_VERBATIM(r, head[((MD_BLOCK_H_DETAIL*)detail)->level - 1]); break;
        case MD_BLOCK_CODE:     render_open_code_block(r, (const MD_BLOCK_CODE_DETAIL*) detail); break;
        case MD_BLOCK_HTML:     /* noop */ break;
        case MD_BLOCK_P:        RENDER_VERBATIM(r, "<p>"); break;
        case MD_BLOCK_TABLE:    RENDER_VERBATIM(r, "<table>\n"); break;
        case MD_BLOCK_THEAD:    RENDER_VERBATIM(r, "<thead>\n"); break;
        case MD_BLOCK_TBODY:    RENDER_VERBATIM(r, "<tbody>\n"); break;
        case MD_BLOCK_TR:       RENDER_VERBATIM(r, "<tr>\n"); break;
        case MD_BLOCK_TH:       render_open_td_block(r, "th", (MD_BLOCK_TD_DETAIL*)detail); break;
        case MD_BLOCK_TD:       render_open_td_block(r, "td", (MD_BLOCK_TD_DETAIL*)detail); break;
    }

    return 0;
}